

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

sample_type __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
::encode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
           *this,int32_t x,int32_t ra,int32_t rb)

{
  default_traits<unsigned_short,_unsigned_short> *this_00;
  unsigned_short uVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  
  iVar2 = ra - rb;
  iVar4 = -iVar2;
  if (0 < iVar2) {
    iVar4 = iVar2;
  }
  this_00 = &this->traits_;
  if ((this->traits_).near_lossless < iVar4) {
    iVar4 = (uint)(ra <= rb) * 2 + -1;
    iVar3 = default_traits<unsigned_short,_unsigned_short>::compute_error_value
                      (this_00,(x - rb) * iVar4);
    encode_run_interruption_error(this,(this->context_run_mode_)._M_elems,iVar3);
    iVar3 = ((this->traits_).near_lossless * 2 + 1) * iVar4 * iVar3 + rb;
  }
  else {
    iVar3 = default_traits<unsigned_short,_unsigned_short>::compute_error_value(this_00,x - ra);
    encode_run_interruption_error(this,(this->context_run_mode_)._M_elems + 1,iVar3);
    iVar3 = ((this->traits_).near_lossless * 2 + 1) * iVar3 + ra;
  }
  uVar1 = default_traits<unsigned_short,_unsigned_short>::fix_reconstructed_value(this_00,iVar3);
  return uVar1;
}

Assistant:

sample_type encode_run_interruption_pixel(const int32_t x, const int32_t ra, const int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{traits_.compute_error_value(x - ra)};
            encode_run_interruption_error(context_run_mode_[1], error_value);
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{traits_.compute_error_value((x - rb) * sign(rb - ra))};
        encode_run_interruption_error(context_run_mode_[0], error_value);
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }